

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isEndOfAttribute(TokenKind kind)

{
  bool local_9;
  TokenKind kind_local;
  
  if ((((((ushort)(kind - StarCloseParenthesis) < 2) || ((ushort)(kind - CheckerKeyword) < 2)) ||
       (kind == GenerateKeyword)) || ((kind == InterfaceKeyword || (kind == ModuleKeyword)))) ||
     ((kind == PackageKeyword || ((kind == PrimitiveKeyword || (kind == ProgramKeyword)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isEndOfAttribute(TokenKind kind) {
    switch (kind) {
        case TokenKind::StarCloseParenthesis:
            // these indicate a missing *) somewhere
        case TokenKind::Semicolon:
        case TokenKind::PrimitiveKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::InterfaceKeyword:
        case TokenKind::PackageKeyword:
        case TokenKind::CheckerKeyword:
        case TokenKind::GenerateKeyword:
        case TokenKind::ModuleKeyword:
        case TokenKind::ClassKeyword:
            return true;
        default:
            return false;
    }
}